

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIListBox * __thiscall
irr::gui::CGUIEnvironment::addListBox
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id,bool drawBackground
          )

{
  int iVar1;
  IGUIListBox *pIVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 in_RDX;
  IGUIElement *in_RSI;
  IGUIEnvironment *in_RDI;
  CGUIListBox *unaff_retaddr;
  rect<int> in_stack_00000008;
  IGUIListBox *b;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff8c;
  IGUIEnvironment *environment;
  
  environment = in_RDI;
  pIVar2 = (IGUIListBox *)operator_new(0x1d0);
  uVar5 = 1;
  CGUIListBox::CGUIListBox
            (unaff_retaddr,environment,in_RSI,(s32)((ulong)in_RDX >> 0x20),in_stack_00000008,
             SUB81((ulong)in_RDX >> 0x18,0),SUB81((ulong)in_RDX >> 0x10,0),
             SUB81((ulong)in_RDX >> 8,0));
  if ((in_RDI[0xe]._vptr_IGUIEnvironment == (_func_int **)0x0) ||
     (lVar3 = (**(code **)(*in_RDI[0xe]._vptr_IGUIEnvironment + 0x40))(), lVar3 == 0)) {
    iVar1 = (*in_RDI->_vptr_IGUIEnvironment[0x13])();
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*in_RDI->_vptr_IGUIEnvironment[0x13])();
      iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x18))();
      if (iVar1 == 0) {
        iVar1 = (*in_RDI->_vptr_IGUIEnvironment[0x13])();
        uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x58))();
        (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2b])(pIVar2,uVar4)
        ;
      }
    }
  }
  else {
    uVar4 = (**(code **)(*in_RDI[0xe]._vptr_IGUIEnvironment + 0x40))();
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2b])(pIVar2,uVar4);
  }
  IReferenceCounted::drop((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffff8c,uVar5));
  return pIVar2;
}

Assistant:

IGUIListBox *CGUIEnvironment::addListBox(const core::rect<s32> &rectangle,
		IGUIElement *parent, s32 id, bool drawBackground)
{
	IGUIListBox *b = new CGUIListBox(this, parent ? parent : this, id, rectangle,
			true, drawBackground, false);

	if (CurrentSkin && CurrentSkin->getSpriteBank()) {
		b->setSpriteBank(CurrentSkin->getSpriteBank());
	} else if (getBuiltInFont() && getBuiltInFont()->getType() == EGFT_BITMAP) {
		b->setSpriteBank(((IGUIFontBitmap *)getBuiltInFont())->getSpriteBank());
	}

	b->drop();
	return b;
}